

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

void __thiscall
ktx::DiffComplex<KVEntryString>::printJson
          (DiffComplex<KVEntryString> *this,size_t index,PrintIndent *out,int indent,char *space,
          char *nl)

{
  undefined4 in_register_0000000c;
  string local_30;
  
  if ((*(char **)((long)&this->values[index].super__Optional_base<KVEntryString,_false,_false>.
                         _M_payload.super__Optional_payload<KVEntryString,_true,_false,_false>.
                         super__Optional_payload_base<KVEntryString>._M_payload._M_value.
                         super_KVEntry + 8))
      [*(int *)((long)&this->values[index].super__Optional_base<KVEntryString,_false,_false>.
                       _M_payload.super__Optional_payload<KVEntryString,_true,_false,_false>.
                       super__Optional_payload_base<KVEntryString>._M_payload + 0x10) - 1] != '\0')
  {
    KVEntry::extractRawBytes_abi_cxx11_
              (&local_30,(KVEntry *)(this->values + index),false,
               (char *)CONCAT44(in_register_0000000c,indent));
    PrintIndent::operator()(out,3,(char (*) [3])0x1dcb84,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  PrintIndent::operator()
            (out,3,(char (*) [5])0x1d905b,
             (char **)((long)&this->values[index].super__Optional_base<KVEntryString,_false,_false>.
                              _M_payload.super__Optional_payload<KVEntryString,_true,_false,_false>.
                              super__Optional_payload_base<KVEntryString>._M_payload + 8));
  return;
}

Assistant:

void printJson(std::size_t index, PrintIndent& out, int indent, const char* space, const char* nl) const {
        values[index]->printJson(out, indent, space, nl);
    }